

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurvesTests.cpp
# Opt level: O1

void __thiscall
agge::tests::QuadraticBezierCurveTests::
QBezierIteratorProducesExpectedVerticesAccordinglyToParameters(QuadraticBezierCurveTests *this)

{
  qbezier b2;
  qbezier b1;
  undefined1 local_278 [8];
  int local_270;
  point local_26c;
  undefined8 local_260;
  int local_258;
  point local_254;
  point local_248;
  point local_23c;
  undefined1 local_228 [44];
  int local_1fc;
  pointer local_1f8;
  int local_1f0;
  pointer local_1ec;
  int local_1e4;
  point local_1d8;
  undefined8 local_1cc;
  undefined4 local_1c4;
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined8 local_1b4;
  undefined4 local_1ac;
  undefined8 local_1a8;
  undefined4 local_1a0;
  undefined8 local_19c;
  undefined4 local_194;
  undefined8 local_190;
  undefined4 local_188;
  undefined8 local_184;
  undefined4 local_17c;
  undefined8 local_178;
  undefined4 local_170;
  undefined8 local_16c;
  undefined4 local_164;
  undefined8 local_160;
  undefined4 local_158;
  undefined8 local_154;
  undefined4 local_14c;
  point local_148;
  point local_13c;
  point local_130;
  point local_124;
  point local_118;
  point local_10c;
  point local_100;
  point local_f4;
  point local_e8;
  point local_dc;
  point local_d0;
  point local_c4;
  string local_b0;
  LocationInfo local_90;
  qbezier local_68;
  qbezier local_44;
  
  qbezier::qbezier(&local_44,-3.5,7.4,1.0,2.0,10.1,3.8,0.111);
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_148.command = qbezier::vertex(&local_44,&local_1d8.x,&local_1d8.y);
  local_148.x = local_1d8.x;
  local_148.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_13c.command = qbezier::vertex(&local_44,&local_1d8.x,&local_1d8.y);
  local_13c.x = local_1d8.x;
  local_13c.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_130.command = qbezier::vertex(&local_44,&local_1d8.x,&local_1d8.y);
  local_130.x = local_1d8.x;
  local_130.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_124.command = qbezier::vertex(&local_44,&local_1d8.x,&local_1d8.y);
  local_124.x = local_1d8.x;
  local_124.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_118.command = qbezier::vertex(&local_44,&local_1d8.x,&local_1d8.y);
  local_118.x = local_1d8.x;
  local_118.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_10c.command = qbezier::vertex(&local_44,&local_1d8.x,&local_1d8.y);
  local_10c.x = local_1d8.x;
  local_10c.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_100.command = qbezier::vertex(&local_44,&local_1d8.x,&local_1d8.y);
  local_100.x = local_1d8.x;
  local_100.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_f4.command = qbezier::vertex(&local_44,&local_1d8.x,&local_1d8.y);
  local_f4.x = local_1d8.x;
  local_f4.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_e8.command = qbezier::vertex(&local_44,&local_1d8.x,&local_1d8.y);
  local_e8.x = local_1d8.x;
  local_e8.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_dc.command = qbezier::vertex(&local_44,&local_1d8.x,&local_1d8.y);
  local_dc.x = local_1d8.x;
  local_dc.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_d0.command = qbezier::vertex(&local_44,&local_1d8.x,&local_1d8.y);
  local_d0.x = local_1d8.x;
  local_d0.y = local_1d8.y;
  local_1d8.command = 0;
  local_1d8.x = 0.0;
  local_1d8.y = 0.0;
  local_c4.command = qbezier::vertex(&local_44,&local_1d8.x,&local_1d8.y);
  local_c4.x = local_1d8.x;
  local_c4.y = local_1d8.y;
  local_1d8.x = -3.5;
  local_1d8.y = 7.4;
  local_1d8.command = 1;
  local_1cc = 0x40c946f3c01c6fcc;
  local_1c4 = 2;
  local_1c0 = 0x40ab6e8dbfa33cd2;
  local_1b8 = 2;
  local_1b4 = 0x409343973be84e00;
  local_1ac = 2;
  local_1a8 = 0x4080c6133fb38fcc;
  local_1a0 = 2;
  local_19c = 0x4067ec03403a5cd2;
  local_194 = 2;
  local_190 = 0x4059a6c240911975;
  local_188 = 2;
  local_184 = 0x4056bc6540c8a51a;
  local_17c = 2;
  local_178 = 0x405f2ceb4101e8aa;
  local_170 = 2;
  local_16c = 0x4072f85641214f13;
  local_164 = 2;
  local_160 = 0x407333334121999a;
  local_158 = 2;
  local_154 = 0;
  local_14c = 0;
  local_278 = (undefined1  [8])&local_26c.y;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_278,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_228,(string *)local_278,0x73);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,12ul>
            ((point (*) [12])&local_1d8,(point (*) [12])&local_148,(LocationInfo *)local_228);
  if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
    operator_delete((void *)local_228._0_8_);
  }
  if (local_278 != (undefined1  [8])&local_26c.y) {
    operator_delete((void *)local_278);
  }
  qbezier::qbezier(&local_68,1.0,1.0,0.0,0.0,-1.0,1.0,0.3);
  local_270 = 0;
  local_278 = (undefined1  [8])0x0;
  local_228._8_4_ = qbezier::vertex(&local_68,(real_t *)local_278,(real_t *)(local_278 + 4));
  local_228._0_8_ = local_278;
  local_270 = 0;
  local_278 = (undefined1  [8])0x0;
  local_228._20_4_ = qbezier::vertex(&local_68,(real_t *)local_278,(real_t *)(local_278 + 4));
  local_228._12_8_ = local_278;
  local_270 = 0;
  local_278 = (undefined1  [8])0x0;
  local_228._32_4_ = qbezier::vertex(&local_68,(real_t *)local_278,(real_t *)(local_278 + 4));
  local_228._24_8_ = local_278;
  local_270 = 0;
  local_278 = (undefined1  [8])0x0;
  local_1fc = qbezier::vertex(&local_68,(real_t *)local_278,(real_t *)(local_278 + 4));
  local_228._36_8_ = local_278;
  local_270 = 0;
  local_278 = (undefined1  [8])0x0;
  local_1f0 = qbezier::vertex(&local_68,(real_t *)local_278,(real_t *)(local_278 + 4));
  local_1f8 = (pointer)local_278;
  local_270 = 0;
  local_278 = (undefined1  [8])0x0;
  local_1e4 = qbezier::vertex(&local_68,(real_t *)local_278,(real_t *)(local_278 + 4));
  local_1ec = (pointer)local_278;
  local_278 = (undefined1  [8])0x3f8000003f800000;
  local_270 = 1;
  local_26c.x = 0.39999998;
  local_26c.y = 0.58;
  local_26c.command = 2;
  local_260 = 0x3f051eb8be4ccccf;
  local_258 = 2;
  local_254.x = -0.8000001;
  local_254.y = 0.82000005;
  local_254.command = 2;
  local_248.x = -1.0;
  local_248.y = 1.0;
  local_248.command = 2;
  local_23c.x = 0.0;
  local_23c.y = 0.0;
  local_23c.command = 0;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_90,&local_b0,0x87);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,6ul>
            ((point (*) [6])local_278,(point (*) [6])local_228,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.filename._M_dataplus._M_p != &local_90.filename.field_2) {
    operator_delete(local_90.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

test( QBezierIteratorProducesExpectedVerticesAccordinglyToParameters )
			{
				// INIT
				qbezier b1(-3.5f, 7.4f, 1.0f, 2.0f, 10.1f, 3.8f, 0.111f);

				// ACT
				mocks::path::point points1[] = {
					vertex(b1), vertex(b1), vertex(b1), vertex(b1), vertex(b1),
					vertex(b1), vertex(b1), vertex(b1), vertex(b1), vertex(b1),
					vertex(b1), vertex(b1),
				};

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(-3.50000000f, 7.40000010f),
					lineto(-2.44432354f, 6.28991079f),
					lineto(-1.27529359f, 5.35724497f),
					lineto(0.00708937645f, 4.60200071f),
					lineto(1.40282583f, 4.02417898f),
					lineto(2.91191530f, 3.62378001f),
					lineto(4.53435755f, 3.40080309f),
					lineto(6.27015400f, 3.35524869f),
					lineto(8.11930275f, 3.48711658f),
					lineto(10.0818052f, 3.79640722f),
					lineto(10.1000004f, 3.79999995f),
					stop(),
				};

				assert_equal(reference1, points1);

				// INIT
				qbezier b2(1.0f, 1.0f, 0.0f, 0.0f, -1.0f, 1.0f, 0.3f);

				// ACT
				mocks::path::point points2[] = {
					vertex(b2), vertex(b2), vertex(b2), vertex(b2), vertex(b2), vertex(b2),
				};

				// ASSERT
				mocks::path::point reference2[] = {
					moveto(1.00000000f, 1.00000000f),
					lineto(0.399999976f, 0.579999983f),
					lineto(-0.200000033f, 0.519999981f),
					lineto(-0.800000072f, 0.820000052f),
					lineto(-1.00000000f, 1.00000000f),
					stop(),
				};

				assert_equal(reference2, points2);
			}